

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dbp_decoder.hpp
# Opt level: O3

void __thiscall
duckdb::DbpDecoder::GetBatchInternal<unsigned_int,false>
          (DbpDecoder *this,data_ptr_t target_values_ptr,idx_t batch_size)

{
  uint64_t *puVar1;
  int64_t iVar2;
  data_ptr_t pdVar3;
  idx_t iVar4;
  unsigned_long uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  if (batch_size != 0) {
    bVar11 = this->is_first_value == true;
    if (bVar11) {
      *(int *)target_values_ptr = (int)this->previous_value;
      this->is_first_value = false;
    }
    uVar10 = (ulong)bVar11;
    if (uVar10 < batch_size) {
      iVar4 = this->unpacked_data_offset;
      do {
        uVar6 = 0x20 - iVar4;
        if (batch_size - uVar10 < 0x20 - iVar4) {
          uVar6 = batch_size - uVar10;
        }
        if (uVar6 == 0) {
          iVar4 = this->miniblock_index;
          if (this->miniblock_offset == this->number_of_values_in_a_miniblock) {
            this->miniblock_offset = 0;
            iVar4 = iVar4 + 1;
            this->miniblock_index = iVar4;
            if (iVar4 == this->number_of_miniblocks_per_block) {
              uVar5 = ParquetDecodeUtils::VarintDecode<unsigned_long,true>(&this->buffer_);
              this->min_delta = -(ulong)((uint)uVar5 & 1) ^ uVar5 >> 1;
              ByteBuffer::available(&this->buffer_,this->number_of_miniblocks_per_block);
              pdVar3 = (this->buffer_).ptr;
              iVar4 = this->number_of_miniblocks_per_block;
              this->list_of_bitwidths_of_miniblocks = pdVar3;
              puVar1 = &(this->buffer_).len;
              *puVar1 = *puVar1 - iVar4;
              (this->buffer_).ptr = pdVar3 + iVar4;
              this->miniblock_index = 0;
              iVar4 = 0;
            }
          }
          ParquetDecodeUtils::BitUnpackAligned<unsigned_long>
                    (&this->buffer_,this->unpacked_data,0x20,
                     this->list_of_bitwidths_of_miniblocks[iVar4]);
          this->unpacked_data_offset = 0;
          this->miniblock_offset = this->miniblock_offset + 0x20;
          iVar4 = 0;
        }
        else {
          uVar8 = this->previous_value;
          iVar2 = this->min_delta;
          uVar9 = 0;
          do {
            uVar7 = (int)uVar8 + (int)iVar2 + (int)this->unpacked_data[iVar4 + uVar9];
            *(uint *)(target_values_ptr + uVar9 * 4 + uVar10 * 4) = uVar7;
            uVar8 = (ulong)uVar7;
            this->previous_value = uVar8;
            uVar9 = uVar9 + 1;
          } while (uVar6 != uVar9);
          uVar10 = uVar10 + uVar6;
          iVar4 = iVar4 + uVar6;
          this->unpacked_data_offset = iVar4;
        }
      } while (uVar10 < batch_size);
    }
  }
  return;
}

Assistant:

void GetBatchInternal(const data_ptr_t target_values_ptr, const idx_t batch_size) {
		if (batch_size == 0) {
			return;
		}
		D_ASSERT(target_values_ptr || SKIP_READ);

		T *target_values = nullptr;
		if (!SKIP_READ) {
			target_values = reinterpret_cast<T *>(target_values_ptr);
		}
		idx_t target_values_offset = 0;
		if (is_first_value) {
			if (!SKIP_READ) {
				target_values[0] = static_cast<T>(previous_value);
			}
			target_values_offset++;
			is_first_value = false;
		}

		while (target_values_offset < batch_size) {
			// Copy over any remaining data
			const idx_t next = MinValue(batch_size - target_values_offset,
			                            BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE - unpacked_data_offset);
			if (next != 0) {
				for (idx_t i = 0; i < next; i++) {
					const auto &unpacked_value = unpacked_data[unpacked_data_offset + i];
					auto current_value = static_cast<T>(static_cast<uint64_t>(previous_value) +
					                                    static_cast<uint64_t>(min_delta) + unpacked_value);
					if (!SKIP_READ) {
						target_values[target_values_offset + i] = current_value;
					}
					previous_value = static_cast<int64_t>(current_value);
				}
				target_values_offset += next;
				unpacked_data_offset += next;
				continue;
			}

			// Move to next miniblock / block
			D_ASSERT(unpacked_data_offset == BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE);
			D_ASSERT(miniblock_index < number_of_miniblocks_per_block);
			D_ASSERT(miniblock_offset <= number_of_values_in_a_miniblock);
			if (miniblock_offset == number_of_values_in_a_miniblock) {
				miniblock_offset = 0;
				if (++miniblock_index == number_of_miniblocks_per_block) {
					// <min delta> <list of bitwidths of miniblocks> <miniblocks>
					min_delta = ParquetDecodeUtils::ZigzagToInt(ParquetDecodeUtils::VarintDecode<uint64_t>(buffer_));
					buffer_.available(number_of_miniblocks_per_block);
					list_of_bitwidths_of_miniblocks = buffer_.ptr;
					buffer_.unsafe_inc(number_of_miniblocks_per_block);
					miniblock_index = 0;
				}
			}

			// Unpack from current miniblock
			ParquetDecodeUtils::BitUnpackAligned(buffer_, unpacked_data,
			                                     BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE,
			                                     list_of_bitwidths_of_miniblocks[miniblock_index]);
			unpacked_data_offset = 0;
			miniblock_offset += BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;
		}
	}